

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

void __thiscall tcmalloc::CentralFreeList::Init(CentralFreeList *this,size_t cl)

{
  int iVar1;
  int iVar2;
  
  this->size_class_ = cl;
  DLL_Init(&this->empty_);
  DLL_Init(&this->nonempty_);
  this->num_spans_ = 0;
  this->counter_ = 0;
  this->cache_size_ = 0x10;
  this->max_cache_size_ = 0x40;
  if (cl != 0) {
    iVar2 = (int)(0x100000 /
                 (long)(int)((&DAT_0013bc84)[cl & 0xffffffff] * (&DAT_0013be84)[cl & 0xffffffff]));
    iVar1 = 1;
    if (1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar2 = 0x40;
    if (iVar1 < 0x40) {
      iVar2 = iVar1;
    }
    this->max_cache_size_ = iVar2;
    iVar2 = 0x10;
    if (iVar1 < 0x10) {
      iVar2 = iVar1;
    }
    this->cache_size_ = iVar2;
  }
  this->used_slots_ = 0;
  return;
}

Assistant:

void CentralFreeList::Init(size_t cl) {
  size_class_ = cl;
  tcmalloc::DLL_Init(&empty_);
  tcmalloc::DLL_Init(&nonempty_);
  num_spans_ = 0;
  counter_ = 0;

  max_cache_size_ = kMaxNumTransferEntries;
#ifdef TCMALLOC_SMALL_BUT_SLOW
  // Disable the transfer cache for the small footprint case.
  cache_size_ = 0;
#else
  cache_size_ = 16;
#endif
  if (cl > 0) {
    // Limit the maximum size of the cache based on the size class.  If this
    // is not done, large size class objects will consume a lot of memory if
    // they just sit in the transfer cache.
    int32_t bytes = Static::sizemap()->ByteSizeForClass(cl);
    int32_t objs_to_move = Static::sizemap()->num_objects_to_move(cl);

    ASSERT(objs_to_move > 0 && bytes > 0);
    // Limit each size class cache to at most 1MB of objects or one entry,
    // whichever is greater. Total transfer cache memory used across all
    // size classes then can't be greater than approximately
    // 1MB * kMaxNumTransferEntries.
    max_cache_size_ = std::min(max_cache_size_,
                               std::max(1, (1024 * 1024) / (bytes * objs_to_move)));
    cache_size_ = std::min(cache_size_, max_cache_size_);
  }
  used_slots_ = 0;
  ASSERT(cache_size_ <= max_cache_size_);
}